

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O2

void __thiscall
license::locate::EnvironmentVarLocation::~EnvironmentVarLocation(EnvironmentVarLocation *this)

{
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__0056bdb8;
  std::__cxx11::string::~string((string *)&(this->super_LocatorStrategy).m_strategy_name);
  return;
}

Assistant:

EnvironmentVarLocation::~EnvironmentVarLocation() {}